

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

string * __thiscall
vkt::SpirVAssembly::getAsmTypeDeclaration_abi_cxx11_
          (string *__return_storage_ptr__,SpirVAssembly *this,IntegerType type)

{
  bool bVar1;
  IntegerType type_00;
  char *local_a8;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string sign;
  IntegerType type_local;
  
  sign.field_2._12_4_ = SUB84(this,0);
  bVar1 = isSigned(sign.field_2._12_4_);
  if (bVar1) {
    local_a8 = "%type = OpTypeInt 32 1";
  }
  else {
    local_a8 = "%type = OpTypeInt 32 0";
  }
  local_a8 = local_a8 + 0x14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,local_a8,&local_39);
  std::allocator<char>::~allocator(&local_39);
  getBitWidthStr_abi_cxx11_(&local_90,(SpirVAssembly *)(ulong)(uint)sign.field_2._12_4_,type_00);
  std::operator+(&local_70,"OpTypeInt ",&local_90);
  std::operator+(__return_storage_ptr__,&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

const string getAsmTypeDeclaration (IntegerType type)
{
	string sign = isSigned(type) ? " 1" : " 0";
	return "OpTypeInt " + getBitWidthStr(type) + sign;
}